

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vga_ManRollBack(Vta_Man_t *p,int nObjOld)

{
  Vta_Obj_t *pVVar1;
  int i;
  int *piVar2;
  Vta_Obj_t *pVVar3;
  Vta_Obj_t *pVVar4;
  int iVar5;
  long lVar6;
  
  pVVar1 = p->pObjs;
  lVar6 = (long)nObjOld;
  pVVar4 = pVVar1 + lVar6;
  iVar5 = p->nObjs;
  while( true ) {
    if (pVVar1 + iVar5 <= pVVar4) {
      iVar5 = 0;
      memset(p->pObjs + lVar6,0,(p->nObjs - lVar6) * 0x10);
      p->nObjs = nObjOld;
      do {
        if (p->vAddedNew->nSize <= iVar5) {
          return;
        }
        i = Vec_IntEntry(p->vAddedNew,iVar5);
        if (i < p->nObjs) {
          pVVar4 = Vta_ManObj(p,i);
          if ((*(uint *)&pVVar4->field_0xc >> 0x1e & 1) == 0) {
            __assert_fail("pThis->fAdded == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                          ,0x558,"void Vga_ManRollBack(Vta_Man_t *, int)");
          }
          *(uint *)&pVVar4->field_0xc = *(uint *)&pVVar4->field_0xc & 0xbfffffff;
        }
        iVar5 = iVar5 + 1;
      } while( true );
    }
    piVar2 = Vga_ManLookup(p,pVVar4->iObj,pVVar4->iFrame);
    pVVar3 = Vta_ManObj(p,*piVar2);
    if (pVVar3 == (Vta_Obj_t *)0x0) break;
    *piVar2 = pVVar3->iNext;
    pVVar3->iNext = -1;
    pVVar4 = pVVar4 + 1;
  }
  __assert_fail("pThis != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                ,0x145,"void Vga_ManDelete(Vta_Man_t *, int, int)");
}

Assistant:

void Vga_ManRollBack( Vta_Man_t * p, int nObjOld )
{
    Vta_Obj_t * pThis  = p->pObjs + nObjOld;
    Vta_Obj_t * pLimit = p->pObjs + p->nObjs;
    int i, Entry;
    for ( ; pThis < pLimit; pThis++ )
        Vga_ManDelete( p, pThis->iObj, pThis->iFrame );
    memset( p->pObjs + nObjOld, 0, sizeof(Vta_Obj_t) * (p->nObjs - nObjOld) );
    p->nObjs = nObjOld;
    Vec_IntForEachEntry( p->vAddedNew, Entry, i )
        if ( Entry < p->nObjs )
        {
            pThis = Vta_ManObj(p, Entry);
            assert( pThis->fAdded == 1 );
            pThis->fAdded = 0;
        }
}